

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O2

void density::f_destroy::
     invoke<density_tests::LfQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_put_transaction_samples()::Msg>
               (void *i_object)

{
  return;
}

Assistant:

static void invoke(void * i_object) noexcept
        {
            DENSITY_ASSUME(i_object != nullptr);
            TARGET_TYPE * obj = static_cast<TARGET_TYPE *>(i_object);
            static_assert(
              noexcept(obj->TARGET_TYPE::~TARGET_TYPE()),
              "TARGET_TYPE must be nothrow destructible");
            obj->TARGET_TYPE::~TARGET_TYPE();
        }